

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O1

hrgls_Message __thiscall hrgls::Message::RawMessage(Message *this)

{
  Message_private *pMVar1;
  hrgls_Status hVar2;
  hrgls_Message phVar3;
  
  pMVar1 = this->m_private;
  phVar3 = (hrgls_Message)0x0;
  if (pMVar1 != (Message_private *)0x0) {
    phVar3 = pMVar1->Message;
    hVar2 = 0;
    if (phVar3 == (hrgls_Message)0x0) {
      hVar2 = 0x3ee;
    }
    pMVar1->status = hVar2;
  }
  return phVar3;
}

Assistant:

hrgls_Message const Message::RawMessage() const
  {
    hrgls_Message ret = nullptr;
    if (!m_private) {
      return ret;
    }
    if (!m_private->Message) {
      m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
      return ret;
    }
    m_private->status = hrgls_STATUS_OKAY;
    return m_private->Message;
  }